

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

ARMCacheAttrs combine_cacheattrs(ARMCacheAttrs s1,ARMCacheAttrs s2)

{
  uint8_t s1_00;
  uint8_t s2_00;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ushort uVar6;
  undefined2 local_14;
  uint8_t s2hi;
  uint8_t s1hi;
  uint8_t s2lo;
  uint8_t s1lo;
  ARMCacheAttrs s2_local;
  ARMCacheAttrs s1_local;
  ARMCacheAttrs ret;
  
  _s2hi = s1._0_2_;
  uVar4 = extract32((uint)(_s2hi & 0xff),0,4);
  s1_00 = (uint8_t)uVar4;
  local_14 = s2._0_2_;
  uVar4 = extract32((uint)(local_14 & 0xff),0,4);
  s2_00 = (uint8_t)uVar4;
  uVar4 = extract32((uint)(_s2hi & 0xff),4,4);
  uVar5 = extract32((uint)(local_14 & 0xff),4,4);
  if (((_s2hi >> 8 & 3) == 2) || ((local_14 >> 8 & 3) == 2)) {
    s2_local = (ARMCacheAttrs)((uint)s2_local & 0xfffffcff | 0x200);
  }
  else if (((_s2hi >> 8 & 3) == 3) || ((local_14 >> 8 & 3) == 3)) {
    s2_local = (ARMCacheAttrs)((uint)s2_local & 0xfffffcff | 0x300);
  }
  else {
    s2_local = (ARMCacheAttrs)((uint)s2_local & 0xfffffcff);
  }
  if (((uint8_t)uVar4 == '\0') || ((uint8_t)uVar5 == '\0')) {
    if ((s1_00 == '\0') || (s2_00 == '\0')) {
      s2_local = (ARMCacheAttrs)((uint)s2_local & 0xffffff00);
    }
    else if ((s1_00 == '\x04') || (s2_00 == '\x04')) {
      s2_local = (ARMCacheAttrs)((uint)s2_local & 0xffffff00 | 4);
    }
    else if ((s1_00 == '\b') || (s2_00 == '\b')) {
      s2_local = (ARMCacheAttrs)((uint)s2_local & 0xffffff00 | 8);
    }
    else {
      s2_local = (ARMCacheAttrs)((uint)s2_local & 0xffffff00 | 0xc);
    }
    s2_local = (ARMCacheAttrs)((uint)s2_local & 0xfffffcff | 0x200);
  }
  else {
    bVar1 = combine_cacheattr_nibble((uint8_t)uVar4,(uint8_t)uVar5);
    bVar2 = combine_cacheattr_nibble(s1_00,s2_00);
    uVar6 = (bVar1 & 0xf) << 4 | (ushort)bVar2;
    uVar3 = s2_local._0_2_ & 0xff00 | uVar6;
    if (uVar6 == 0x44) {
      uVar3 = s2_local._0_2_ & 0xfc00 | 0x244;
    }
    s2_local._0_2_ = uVar3;
  }
  return s2_local;
}

Assistant:

static ARMCacheAttrs combine_cacheattrs(ARMCacheAttrs s1, ARMCacheAttrs s2)
{
    uint8_t s1lo = extract32(s1.attrs, 0, 4), s2lo = extract32(s2.attrs, 0, 4);
    uint8_t s1hi = extract32(s1.attrs, 4, 4), s2hi = extract32(s2.attrs, 4, 4);
    ARMCacheAttrs ret;

    /* Combine shareability attributes (table D4-43) */
    if (s1.shareability == 2 || s2.shareability == 2) {
        /* if either are outer-shareable, the result is outer-shareable */
        ret.shareability = 2;
    } else if (s1.shareability == 3 || s2.shareability == 3) {
        /* if either are inner-shareable, the result is inner-shareable */
        ret.shareability = 3;
    } else {
        /* both non-shareable */
        ret.shareability = 0;
    }

    /* Combine memory type and cacheability attributes */
    if (s1hi == 0 || s2hi == 0) {
        /* Device has precedence over normal */
        if (s1lo == 0 || s2lo == 0) {
            /* nGnRnE has precedence over anything */
            ret.attrs = 0;
        } else if (s1lo == 4 || s2lo == 4) {
            /* non-Reordering has precedence over Reordering */
            ret.attrs = 4;  /* nGnRE */
        } else if (s1lo == 8 || s2lo == 8) {
            /* non-Gathering has precedence over Gathering */
            ret.attrs = 8;  /* nGRE */
        } else {
            ret.attrs = 0xc; /* GRE */
        }

        /* Any location for which the resultant memory type is any
         * type of Device memory is always treated as Outer Shareable.
         */
        ret.shareability = 2;
    } else { /* Normal memory */
        /* Outer/inner cacheability combine independently */
        ret.attrs = combine_cacheattr_nibble(s1hi, s2hi) << 4
                  | combine_cacheattr_nibble(s1lo, s2lo);

        if (ret.attrs == 0x44) {
            /* Any location for which the resultant memory type is Normal
             * Inner Non-cacheable, Outer Non-cacheable is always treated
             * as Outer Shareable.
             */
            ret.shareability = 2;
        }
    }

    return ret;
}